

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphprll(fitsfile *fptr,int simple,int bitpix,int naxis,LONGLONG *naxes,LONGLONG pcount,
            LONGLONG gcount,int extend,int *status)

{
  uint uVar1;
  int iVar2;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  char card [81];
  char message [81];
  char comm [73];
  char name [75];
  long tnaxes [20];
  long longbitpix;
  int ii;
  char acStack_248 [40];
  int *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  char local_1e8 [8];
  int *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  fitsfile *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  fitsfile *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  fitsfile *in_stack_fffffffffffffe88;
  undefined8 local_e8 [10];
  int *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  long *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  fitsfile *in_stack_ffffffffffffff88;
  int local_34;
  int local_4;
  
  if (*(int *)card._24_8_ < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
             in_stack_fffffffffffffe20);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x70) ==
        *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                 (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) {
      if ((in_ECX == 0) || (*(int *)(*(long *)(in_RDI + 2) + 1000) == 0)) {
        if (*(int *)(*(long *)(in_RDI + 2) + 0x54) == 0) {
          if (in_ESI == 0) {
            strcpy(&stack0xfffffffffffffe78,"file does not conform to FITS standard");
          }
          else {
            strcpy(&stack0xfffffffffffffe78,"file does conform to FITS standard");
          }
          ffpkyl(in_stack_fffffffffffffe78,
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
        }
        else {
          strcpy(&stack0xfffffffffffffe78,"IMAGE extension");
          ffpkys(in_stack_fffffffffffffe78,
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        }
        if (in_EDX == 0x14) {
          uVar1 = 0x10;
        }
        else if (in_EDX == 0x28) {
          uVar1 = 0x20;
        }
        else if (in_EDX == 0x50) {
          uVar1 = 0x40;
        }
        else {
          uVar1 = in_EDX;
          if (in_EDX == 10) {
            uVar1 = 8;
          }
        }
        if (((((uVar1 == 8) || (uVar1 == 0x10)) || (uVar1 == 0x20)) ||
            ((uVar1 == 0x40 || (uVar1 == 0xffffffe0)))) || (uVar1 == 0xffffffc0)) {
          strcpy(&stack0xfffffffffffffe78,"number of bits per data pixel");
          iVar2 = ffpkyj(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          if (iVar2 < 1) {
            if (((int)in_ECX < 0) || (999 < (int)in_ECX)) {
              snprintf(local_1e8,0x51,"Illegal value for NAXIS keyword: %d",(ulong)in_ECX);
              ffpmsg((char *)0x22eec3);
              *(undefined4 *)card._24_8_ = 0xd4;
              local_4 = 0xd4;
            }
            else {
              strcpy(&stack0xfffffffffffffe78,"number of data axes");
              ffpkyj(in_stack_fffffffffffffe78,
                     (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              strcpy(&stack0xfffffffffffffe78,"length of data axis ");
              for (local_34 = 0; local_34 < (int)in_ECX; local_34 = local_34 + 1) {
                if (*(long *)(in_R8 + (long)local_34 * 8) < 0) {
                  snprintf(local_1e8,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
                           (double)*(long *)(in_R8 + (long)local_34 * 8),(ulong)(local_34 + 1));
                  ffpmsg((char *)0x22efad);
                  *(undefined4 *)card._24_8_ = 0xd5;
                  return 0xd5;
                }
                snprintf(&stack0xfffffffffffffe8c,0x35,"%d",(ulong)(local_34 + 1));
                ffkeyn(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8
                       ,in_stack_fffffffffffffde0);
                ffpkyj(in_stack_fffffffffffffe78,
                       (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              }
              if (*(int *)(*(long *)(in_RDI + 2) + 0x54) == 0) {
                if (card._16_4_ != 0) {
                  strcpy(&stack0xfffffffffffffe78,"FITS dataset may contain extensions");
                  ffpkyl(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58);
                }
                if (in_R9 < 0) {
                  ffpmsg((char *)0x22f0df);
                  *(undefined4 *)card._24_8_ = 0xd6;
                  return 0xd6;
                }
                if ((long)card._8_8_ < 1) {
                  ffpmsg((char *)0x22f114);
                  *(undefined4 *)card._24_8_ = 0xd7;
                  return 0xd7;
                }
                if ((0 < in_R9) || (1 < (long)card._8_8_)) {
                  strcpy(&stack0xfffffffffffffe78,"random group records are present");
                  ffpkyl(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60,
                         in_stack_fffffffffffffe58);
                  strcpy(&stack0xfffffffffffffe78,"number of random group parameters");
                  ffpkyj(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                  strcpy(&stack0xfffffffffffffe78,"number of random groups");
                  ffpkyj(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                }
              }
              else if (in_R9 == 0) {
                if (card._8_8_ == 1) {
                  strcpy(&stack0xfffffffffffffe78,"required keyword; must = 0");
                  ffpkyj(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                  strcpy(&stack0xfffffffffffffe78,"required keyword; must = 1");
                  ffpkyj(in_stack_fffffffffffffe78,
                         (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
                }
                else {
                  ffpmsg((char *)0x22f253);
                  *(undefined4 *)card._24_8_ = 0xd7;
                }
              }
              else {
                ffpmsg((char *)0x22f229);
                *(undefined4 *)card._24_8_ = 0xd6;
              }
              if (in_EDX == 0x14) {
                strcpy(&stack0xfffffffffffffe78,"offset data range to that of unsigned short");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
                strcpy(&stack0xfffffffffffffe78,"default scaling factor");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
              }
              else if (in_EDX == 0x28) {
                strcpy(&stack0xfffffffffffffe78,"offset data range to that of unsigned long");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
                strcpy(&stack0xfffffffffffffe78,"default scaling factor");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
              }
              else if (in_EDX == 0x50) {
                strcpy(acStack_248,
                       "BZERO   =  9223372036854775808 / offset data range to that of unsigned long long"
                      );
                ffprec(in_stack_fffffffffffffe38,
                       (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe28);
                strcpy(&stack0xfffffffffffffe78,"default scaling factor");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
              }
              else if (in_EDX == 10) {
                strcpy(&stack0xfffffffffffffe78,"offset data range to that of signed byte");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
                strcpy(&stack0xfffffffffffffe78,"default scaling factor");
                ffpkyg(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       (double)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                       (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       in_stack_fffffffffffffe60);
              }
              local_4 = *(int *)card._24_8_;
            }
          }
          else {
            local_4 = *(int *)card._24_8_;
          }
        }
        else {
          snprintf(local_1e8,0x51,"Illegal value for BITPIX keyword: %d",(ulong)in_EDX);
          ffpmsg((char *)0x22ee0a);
          *(undefined4 *)card._24_8_ = 0xd3;
          local_4 = 0xd3;
        }
      }
      else {
        for (local_34 = 0; local_34 < (int)in_ECX; local_34 = local_34 + 1) {
          local_e8[local_34] = *(undefined8 *)(in_R8 + (long)local_34 * 8);
        }
        imcomp_init_table(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
        local_4 = *(int *)card._24_8_;
      }
    }
    else {
      *(undefined4 *)card._24_8_ = 0xc9;
      local_4 = 0xc9;
    }
  }
  else {
    local_4 = *(int *)card._24_8_;
  }
  return local_4;
}

Assistant:

int ffphprll( fitsfile *fptr, /* I - FITS file pointer                        */
            int simple,     /* I - does file conform to FITS standard? 1/0  */
            int bitpix,     /* I - number of bits per data value pixel      */
            int naxis,      /* I - number of axes in the data array         */
            LONGLONG naxes[], /* I - length of each data axis                 */
            LONGLONG pcount,  /* I - number of group parameters (usually 0)   */
            LONGLONG gcount,  /* I - number of random groups (usually 1 or 0) */
            int extend,     /* I - may FITS file have extensions?           */
            int *status)    /* IO - error status                            */
/*
  write required primary header keywords
*/
{
    int ii;
    long longbitpix, tnaxes[20];
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT], message[FLEN_ERRMSG];
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis != 0)   /* never try to compress a null image */
    {
      if ( (fptr->Fptr)->request_compress_type )
      {
      
       for (ii = 0; ii < naxis; ii++)
           tnaxes[ii] = (long) naxes[ii];
	   
        /* write header for a compressed image */
        imcomp_init_table(fptr, bitpix, naxis, tnaxes, 1, status);
        return(*status);
      }
    }  

    if ((fptr->Fptr)->curhdu == 0)
    {                /* write primary array header */
        if (simple)
            strcpy(comm, "file does conform to FITS standard");
        else
            strcpy(comm, "file does not conform to FITS standard");

        ffpkyl(fptr, "SIMPLE", simple, comm, status);
    }
    else
    {               /* write IMAGE extension header */
        strcpy(comm, "IMAGE extension");
        ffpkys(fptr, "XTENSION", "IMAGE", comm, status);
    }

    longbitpix = bitpix;

    /* test for the 3 special cases that represent unsigned integers */
    if (longbitpix == USHORT_IMG)
        longbitpix = SHORT_IMG;
    else if (longbitpix == ULONG_IMG)
        longbitpix = LONG_IMG;
    else if (longbitpix == ULONGLONG_IMG)
        longbitpix = LONGLONG_IMG;
    else if (longbitpix == SBYTE_IMG)
        longbitpix = BYTE_IMG;

    if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG && 
        longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
        longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for BITPIX keyword: %d", bitpix);
        ffpmsg(message);
        return(*status = BAD_BITPIX);
    }

    strcpy(comm, "number of bits per data pixel");
    if (ffpkyj(fptr, "BITPIX", longbitpix, comm, status) > 0)
        return(*status);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    strcpy(comm, "number of data axes");
    ffpkyj(fptr, "NAXIS", naxis, comm, status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], FLEN_COMMENT-20,"%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }

    if ((fptr->Fptr)->curhdu == 0)  /* the primary array */
    {
        if (extend)
        {
            /* only write EXTEND keyword if value = true */
            strcpy(comm, "FITS dataset may contain extensions");
            ffpkyl(fptr, "EXTEND", extend, comm, status);
        }

        if (pcount < 0)
        {
            ffpmsg("pcount value is less than 0");
            return(*status = BAD_PCOUNT);
        }

        else if (gcount < 1)
        {
            ffpmsg("gcount value is less than 1");
            return(*status = BAD_GCOUNT);
        }

        else if (pcount > 0 || gcount > 1)
        {
            /* only write these keyword if non-standard values */
            strcpy(comm, "random group records are present");
            ffpkyl(fptr, "GROUPS", 1, comm, status);

            strcpy(comm, "number of random group parameters");
            ffpkyj(fptr, "PCOUNT", pcount, comm, status);
  
            strcpy(comm, "number of random groups");
            ffpkyj(fptr, "GCOUNT", gcount, comm, status);
        }

      /* write standard block of self-documentating comments */
/*    ffprec(fptr,
      "COMMENT   FITS (Flexible Image Transport System) format is defined in 'Astronomy",
      status);
      ffprec(fptr,
      "COMMENT   and Astrophysics', volume 376, page 359; bibcode: 2001A&A...376..359H",
      status); */
    }

    else  /* an IMAGE extension */

    {   /* image extension; cannot have random groups */
        if (pcount != 0)
        {
            ffpmsg("image extensions must have pcount = 0");
            *status = BAD_PCOUNT;
        }

        else if (gcount != 1)
        {
            ffpmsg("image extensions must have gcount = 1");
            *status = BAD_GCOUNT;
        }

        else
        {
            strcpy(comm, "required keyword; must = 0");
            ffpkyj(fptr, "PCOUNT", 0, comm, status);
  
            strcpy(comm, "required keyword; must = 1");
            ffpkyj(fptr, "GCOUNT", 1, comm, status);
        }
    }

    /* Write the BSCALE and BZERO keywords, if an unsigned integer image */
    if (bitpix == USHORT_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned short");
        ffpkyg(fptr, "BZERO", 32768., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONG_IMG)
    {
        strcpy(comm, "offset data range to that of unsigned long");
        ffpkyg(fptr, "BZERO", 2147483648., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == ULONGLONG_IMG)
    {
        strcpy(card,"BZERO   =  9223372036854775808 / offset data range to that of unsigned long long");
        ffprec(fptr, card, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    else if (bitpix == SBYTE_IMG)
    {
        strcpy(comm, "offset data range to that of signed byte");
        ffpkyg(fptr, "BZERO", -128., 0, comm, status);
        strcpy(comm, "default scaling factor");
        ffpkyg(fptr, "BSCALE", 1.0, 0, comm, status);
    }
    return(*status);
}